

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

bool local::test_uintwide_t_0000064_by_0000064_4_by_4(void)

{
  bool bVar1;
  ostream *this;
  undefined1 local_78 [7];
  bool result_is_ok;
  test_uintwide_t_n_binary_ops_mul_div_4_by_4_template<64U,_unsigned_short,_void>
  test_uintwide_t_n_binary_ops_template_instance;
  
  this = std::operator<<((ostream *)&std::cout,"running: test_uintwide_t_0000064_by_0000064_4_by_4")
  ;
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  test_uintwide_t_n_binary_ops_mul_div_4_by_4_template<64U,_unsigned_short,_void>::
  test_uintwide_t_n_binary_ops_mul_div_4_by_4_template
            ((test_uintwide_t_n_binary_ops_mul_div_4_by_4_template<64U,_unsigned_short,_void> *)
             local_78,0x8000);
  bVar1 = test_uintwide_t_n_binary_ops_mul_div_4_by_4_template<64U,_unsigned_short,_void>::do_test
                    ((test_uintwide_t_n_binary_ops_mul_div_4_by_4_template<64U,_unsigned_short,_void>
                      *)local_78,4);
  test_uintwide_t_n_binary_ops_mul_div_4_by_4_template<64U,_unsigned_short,_void>::
  ~test_uintwide_t_n_binary_ops_mul_div_4_by_4_template
            ((test_uintwide_t_n_binary_ops_mul_div_4_by_4_template<64U,_unsigned_short,_void> *)
             local_78);
  return bVar1;
}

Assistant:

auto test_uintwide_t_0000064_by_0000064_4_by_4() -> bool
{
  std::cout << "running: test_uintwide_t_0000064_by_0000064_4_by_4" << std::endl;
  test_uintwide_t_n_binary_ops_mul_div_4_by_4_template<64U, std::uint16_t> test_uintwide_t_n_binary_ops_template_instance(test_uintwide_t_n_binary_ops_4_by_4_cases); // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
  const auto result_is_ok =
    test_uintwide_t_n_binary_ops_template_instance.do_test(test_uintwide_t_n_binary_ops_rounds);
  return result_is_ok;
}